

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O0

void codeTest(void)

{
  sgr_ostream_wrapper local_498;
  sgr_ostream_wrapper local_380;
  sgr_ostream_wrapper local_268;
  sgr local_140;
  sgr_ostream_wrapper local_120;
  
  cpp_sgr::operator_(&local_140,(sgr *)cpp_sgr::bold,(sgr *)cpp_sgr::underline);
  cpp_sgr::operator<<(&local_120,(ostream *)&std::cout,&local_140);
  cpp_sgr::sgr_ostream_wrapper::operator<<(&local_120,(char (*) [27])"Testing common SGR codes:\n");
  cpp_sgr::sgr_ostream_wrapper::~sgr_ostream_wrapper(&local_120);
  cpp_sgr::sgr::~sgr(&local_140);
  cpp_sgr::operator<<(&local_268,(ostream *)&std::cout,(sgr *)cpp_sgr::bold);
  cpp_sgr::sgr_ostream_wrapper::operator<<(&local_268,(char (*) [11])"Bold text\n");
  cpp_sgr::sgr_ostream_wrapper::~sgr_ostream_wrapper(&local_268);
  cpp_sgr::operator<<(&local_380,(ostream *)&std::cout,(sgr *)cpp_sgr::underline);
  cpp_sgr::sgr_ostream_wrapper::operator<<(&local_380,(char (*) [17])"Underlined text\n");
  cpp_sgr::sgr_ostream_wrapper::~sgr_ostream_wrapper(&local_380);
  cpp_sgr::operator<<(&local_498,(ostream *)&std::cout,(sgr *)cpp_sgr::reverse);
  cpp_sgr::sgr_ostream_wrapper::operator<<(&local_498,(char (*) [16])"Reversed text\n\n");
  cpp_sgr::sgr_ostream_wrapper::~sgr_ostream_wrapper(&local_498);
  return;
}

Assistant:

void codeTest()
{
	std::cout << (bold, underline) << "Testing common SGR codes:\n";
	std::cout << (bold) << "Bold text\n";
	std::cout << (underline) << "Underlined text\n";
	std::cout << (reverse) << "Reversed text\n\n";
}